

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage4_ssse3(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  longlong lVar7;
  longlong lVar8;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  alVar39 = x[8];
  alVar41 = x[10];
  lVar7 = x[0xb][0];
  uVar1 = *(undefined2 *)((long)x[0xb] + 2);
  uVar2 = *(undefined2 *)((long)x[0xb] + 4);
  uVar3 = *(undefined2 *)((long)x[0xb] + 6);
  lVar8 = x[0xb][1];
  uVar4 = *(undefined2 *)((long)x[0xb] + 10);
  uVar5 = *(undefined2 *)((long)x[0xb] + 0xc);
  uVar6 = *(undefined2 *)((long)x[0xb] + 0xe);
  auVar36._0_12_ = alVar39._0_12_;
  auVar36._12_2_ = alVar39[0]._6_2_;
  auVar36._14_2_ = *(undefined2 *)((long)x[9] + 6);
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = alVar39._0_10_;
  auVar35._10_2_ = *(undefined2 *)((long)x[9] + 4);
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = alVar39[0];
  auVar34._8_2_ = alVar39[0]._4_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = *(undefined2 *)((long)x[9] + 2);
  auVar33._4_2_ = alVar39[0]._2_2_;
  auVar33._0_2_ = (undefined2)alVar39[0];
  auVar33._2_2_ = (short)x[9][0];
  auVar20._2_2_ = (short)x[9][1];
  auVar20._0_2_ = (short)alVar39[1];
  auVar20._4_2_ = alVar39[1]._2_2_;
  auVar20._6_2_ = *(undefined2 *)((long)x[9] + 10);
  auVar20._8_2_ = alVar39[1]._4_2_;
  auVar20._10_2_ = *(undefined2 *)((long)x[9] + 0xc);
  auVar20._12_2_ = alVar39[1]._6_2_;
  auVar20._14_2_ = *(undefined2 *)((long)x[9] + 0xe);
  auVar29._8_4_ = 0x31f0fb1;
  auVar29._0_8_ = 0x31f0fb1031f0fb1;
  auVar29._12_4_ = 0x31f0fb1;
  auVar45 = pmaddwd(auVar33,auVar29);
  auVar50 = pmaddwd(auVar20,auVar29);
  auVar53._8_4_ = 0xf04f031f;
  auVar53._0_8_ = 0xf04f031ff04f031f;
  auVar53._12_4_ = 0xf04f031f;
  auVar37 = pmaddwd(auVar33,auVar53);
  auVar21 = pmaddwd(auVar20,auVar53);
  auVar46._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar46._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar46._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar46._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar51._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar51._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar51._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar51._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  alVar47 = (__m128i)packssdw(auVar46,auVar51);
  auVar38._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  auVar22._0_4_ = auVar21._0_4_ + in_XMM0_Da >> 0xc;
  auVar22._4_4_ = auVar21._4_4_ + in_XMM0_Db >> 0xc;
  auVar22._8_4_ = auVar21._8_4_ + in_XMM0_Dc >> 0xc;
  auVar22._12_4_ = auVar21._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar38,auVar22);
  x[8] = alVar47;
  x[9] = alVar39;
  auVar26._0_12_ = alVar41._0_12_;
  auVar26._12_2_ = alVar41[0]._6_2_;
  auVar26._14_2_ = uVar3;
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = alVar41._0_10_;
  auVar25._10_2_ = uVar2;
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._0_8_ = alVar41[0];
  auVar24._8_2_ = alVar41[0]._4_2_;
  auVar23._8_8_ = auVar24._8_8_;
  auVar23._6_2_ = uVar1;
  auVar23._4_2_ = alVar41[0]._2_2_;
  auVar23._0_2_ = (undefined2)alVar41[0];
  auVar23._2_2_ = (short)lVar7;
  auVar11._2_2_ = (short)lVar8;
  auVar11._0_2_ = (short)alVar41[1];
  auVar11._4_2_ = alVar41[1]._2_2_;
  auVar11._6_2_ = uVar4;
  auVar11._8_2_ = alVar41[1]._4_2_;
  auVar11._10_2_ = uVar5;
  auVar11._12_2_ = alVar41[1]._6_2_;
  auVar11._14_2_ = uVar6;
  auVar10._8_4_ = 0xd4e08e4;
  auVar10._0_8_ = 0xd4e08e40d4e08e4;
  auVar10._12_4_ = 0xd4e08e4;
  auVar45 = pmaddwd(auVar23,auVar10);
  auVar50 = pmaddwd(auVar11,auVar10);
  auVar52._8_4_ = 0xf71c0d4e;
  auVar52._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar52._12_4_ = 0xf71c0d4e;
  auVar37 = pmaddwd(auVar23,auVar52);
  auVar21 = pmaddwd(auVar11,auVar52);
  auVar40._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar40._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar40._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar40._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar48._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar40,auVar48);
  auVar27._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar27._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar27._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar27._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  auVar12._0_4_ = auVar21._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar21._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar21._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar21._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar27,auVar12);
  x[10] = alVar41;
  x[0xb] = alVar39;
  alVar39 = x[0xc];
  auVar16._0_12_ = alVar39._0_12_;
  auVar16._12_2_ = alVar39[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0xd] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar39._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)x[0xd] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar39[0];
  auVar14._8_2_ = alVar39[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0xd] + 2);
  auVar13._4_2_ = alVar39[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar39[0];
  auVar13._2_2_ = (short)x[0xd][0];
  auVar28._2_2_ = (short)x[0xd][1];
  auVar28._0_2_ = (short)alVar39[1];
  auVar28._4_2_ = alVar39[1]._2_2_;
  auVar28._6_2_ = *(undefined2 *)((long)x[0xd] + 10);
  auVar28._8_2_ = alVar39[1]._4_2_;
  auVar28._10_2_ = *(undefined2 *)((long)x[0xd] + 0xc);
  auVar28._12_2_ = alVar39[1]._6_2_;
  auVar28._14_2_ = *(undefined2 *)((long)x[0xd] + 0xe);
  auVar42._8_4_ = 0xfb1fce1;
  auVar42._0_8_ = 0xfb1fce10fb1fce1;
  auVar42._12_4_ = 0xfb1fce1;
  auVar45 = pmaddwd(auVar13,auVar42);
  auVar37 = pmaddwd(auVar42,auVar28);
  auVar21 = pmaddwd(auVar13,auVar29);
  auVar29 = pmaddwd(auVar28,auVar29);
  auVar49._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar49._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar49._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar49._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar43._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar49,auVar43);
  auVar17._0_4_ = auVar21._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar21._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar21._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar21._12_4_ + in_XMM0_Dd >> 0xc;
  auVar30._0_4_ = auVar29._0_4_ + in_XMM0_Da >> 0xc;
  auVar30._4_4_ = auVar29._4_4_ + in_XMM0_Db >> 0xc;
  auVar30._8_4_ = auVar29._8_4_ + in_XMM0_Dc >> 0xc;
  auVar30._12_4_ = auVar29._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar17,auVar30);
  x[0xc] = alVar41;
  x[0xd] = alVar39;
  alVar39 = x[0xe];
  auVar37._0_12_ = alVar39._0_12_;
  auVar37._12_2_ = alVar39[0]._6_2_;
  auVar37._14_2_ = *(undefined2 *)((long)x[0xf] + 6);
  auVar50._12_4_ = auVar37._12_4_;
  auVar50._0_10_ = alVar39._0_10_;
  auVar50._10_2_ = *(undefined2 *)((long)x[0xf] + 4);
  auVar45._10_6_ = auVar50._10_6_;
  auVar45._0_8_ = alVar39[0];
  auVar45._8_2_ = alVar39[0]._4_2_;
  auVar21._8_8_ = auVar45._8_8_;
  auVar21._6_2_ = *(undefined2 *)((long)x[0xf] + 2);
  auVar21._4_2_ = alVar39[0]._2_2_;
  auVar21._0_2_ = (undefined2)alVar39[0];
  auVar21._2_2_ = (short)x[0xf][0];
  auVar18._2_2_ = (short)x[0xf][1];
  auVar18._0_2_ = (short)alVar39[1];
  auVar18._4_2_ = alVar39[1]._2_2_;
  auVar18._6_2_ = *(undefined2 *)((long)x[0xf] + 10);
  auVar18._8_2_ = alVar39[1]._4_2_;
  auVar18._10_2_ = *(undefined2 *)((long)x[0xf] + 0xc);
  auVar18._12_2_ = alVar39[1]._6_2_;
  auVar18._14_2_ = *(undefined2 *)((long)x[0xf] + 0xe);
  auVar31._8_4_ = 0x8e4f2b2;
  auVar31._0_8_ = 0x8e4f2b208e4f2b2;
  auVar31._12_4_ = 0x8e4f2b2;
  auVar45 = pmaddwd(auVar21,auVar31);
  auVar37 = pmaddwd(auVar31,auVar18);
  auVar29 = pmaddwd(auVar21,auVar10);
  auVar21 = pmaddwd(auVar18,auVar10);
  auVar44._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar32._0_4_ = auVar37._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar37._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar37._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar37._12_4_ + in_XMM0_Dd >> 0xc;
  alVar41 = (__m128i)packssdw(auVar44,auVar32);
  auVar9._0_4_ = auVar29._0_4_ + in_XMM0_Da >> 0xc;
  auVar9._4_4_ = auVar29._4_4_ + in_XMM0_Db >> 0xc;
  auVar9._8_4_ = auVar29._8_4_ + in_XMM0_Dc >> 0xc;
  auVar9._12_4_ = auVar29._12_4_ + in_XMM0_Dd >> 0xc;
  auVar19._0_4_ = auVar21._0_4_ + in_XMM0_Da >> 0xc;
  auVar19._4_4_ = auVar21._4_4_ + in_XMM0_Db >> 0xc;
  auVar19._8_4_ = auVar21._8_4_ + in_XMM0_Dc >> 0xc;
  auVar19._12_4_ = auVar21._12_4_ + in_XMM0_Dd >> 0xc;
  alVar39 = (__m128i)packssdw(auVar9,auVar19);
  x[0xe] = alVar41;
  x[0xf] = alVar39;
  return;
}

Assistant:

static inline void iadst16_stage4_ssse3(__m128i *x, const int32_t *cospi,
                                        const __m128i __rounding,
                                        int8_t cos_bit) {
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  const __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);
  btf_16_sse2(cospi_p40_p24, cospi_p24_m40, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_m56_p08, cospi_p08_p56, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_m24_p40, cospi_p40_p24, x[14], x[15], x[14], x[15]);
}